

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1cac90::LocalFileSystem::createDirectory(LocalFileSystem *this,string *path)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  StatStruct statbuf;
  stat local_a0;
  
  iVar1 = llbuild::basic::sys::mkdir((path->_M_dataplus)._M_p,(__mode_t)path);
  bVar3 = true;
  if ((char)iVar1 == '\0') {
    piVar2 = __errno_location();
    if (((*piVar2 == 0x11) &&
        (iVar1 = llbuild::basic::sys::lstat((path->_M_dataplus)._M_p,&local_a0), iVar1 == 0)) &&
       ((local_a0.st_mode & 0xf000) == 0x4000)) {
      return true;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

virtual bool
  createDirectory(const std::string& path) override {
    if (!llbuild::basic::sys::mkdir(path.c_str())) {
      if (errno != EEXIST) {
        return false;
      }

      // Target exists, check that it is actually a directory
      llbuild::basic::sys::StatStruct statbuf;
      if (llbuild::basic::sys::lstat(path.c_str(), &statbuf) != 0) {
        return false;
      }
      if (!S_ISDIR(statbuf.st_mode)) {
        return false;
      }
    }
    return true;
  }